

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O3

void __thiscall
kj::ExceptionSafeArrayUtil::construct
          (ExceptionSafeArrayUtil *this,size_t count,_func_void_void_ptr *constructElement)

{
  byte *pbVar1;
  
  if (count != 0) {
    pbVar1 = this->pos;
    do {
      (*constructElement)(pbVar1);
      pbVar1 = this->pos + this->elementSize;
      this->pos = pbVar1;
      this->constructedElementCount = this->constructedElementCount + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void ExceptionSafeArrayUtil::construct(size_t count, void (*constructElement)(void*)) {
  while (count > 0) {
    constructElement(pos);
    pos += elementSize;
    ++constructedElementCount;
    --count;
  }
}